

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

void llama_sampler_softmax_impl(llama_token_data_array *cur_p)

{
  float fVar1;
  long lVar2;
  long *in_RDI;
  float fVar3;
  size_t i_1;
  float p;
  size_t i;
  float cum_sum;
  float max_l;
  ulong local_30;
  ulong local_20;
  float local_14;
  
  if (in_RDI[1] == 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
               ,0xcc,"GGML_ASSERT(%s) failed","cur_p->size > 0");
  }
  if ((*(byte *)(in_RDI + 3) & 1) == 0) {
    std::sort<llama_token_data*,llama_sampler_softmax_impl(llama_token_data_array*)::__0>
              (*in_RDI,*in_RDI + in_RDI[1] * 0xc);
    *(undefined1 *)(in_RDI + 3) = 1;
  }
  fVar1 = *(float *)(*in_RDI + 4);
  local_14 = 0.0;
  for (local_20 = 0; local_20 < (ulong)in_RDI[1]; local_20 = local_20 + 1) {
    fVar3 = expf(*(float *)(*in_RDI + local_20 * 0xc + 4) - fVar1);
    *(float *)(*in_RDI + local_20 * 0xc + 8) = fVar3;
    local_14 = fVar3 + local_14;
  }
  for (local_30 = 0; local_30 < (ulong)in_RDI[1]; local_30 = local_30 + 1) {
    lVar2 = *in_RDI + local_30 * 0xc;
    *(float *)(lVar2 + 8) = *(float *)(lVar2 + 8) / local_14;
  }
  return;
}

Assistant:

static void llama_sampler_softmax_impl(llama_token_data_array * cur_p) {
    GGML_ASSERT(cur_p->size > 0);

    // Sort the logits in descending order
    if (!cur_p->sorted) {
        std::sort(cur_p->data, cur_p->data + cur_p->size, [](const llama_token_data & a, const llama_token_data & b) {
            return a.logit > b.logit;
        });
        cur_p->sorted = true;
    }

    float max_l = cur_p->data[0].logit;
    float cum_sum = 0.0f;

    for (size_t i = 0; i < cur_p->size; ++i) {
        float p = expf(cur_p->data[i].logit - max_l);
        cur_p->data[i].p = p;
        cum_sum += p;
    }

    for (size_t i = 0; i < cur_p->size; ++i) {
        cur_p->data[i].p /= cum_sum;
    }
}